

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_student.cpp
# Opt level: O3

void use_student(void)

{
  Student *this;
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  Student *stu;
  double dVar5;
  Student list [2];
  Student aSStack_88 [2];
  
  L14_1::Student::Student(aSStack_88,3);
  this = aSStack_88 + 1;
  L14_1::Student::Student(this,3);
  set_student(aSStack_88,3);
  set_student(this,3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nResult:\n",9);
  stu = aSStack_88;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    poVar2 = (ostream *)std::ostream::flush();
    L14_1::operator<<(poVar2,stu);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"average: ",9);
    dVar5 = L14_1::Student::get_average(stu);
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    stu = this;
    bVar1 = false;
  } while (bVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done!\n",6);
  lVar3 = 0x30;
  do {
    L14_1::Student::~Student((Student *)((long)&aSStack_88[0]._name._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x30);
  return;
}

Assistant:

void use_student() {
    using namespace L14_1;

    const int num_student = 2;
    const int num_quiz = 3;

    Student list[num_student] = {
            Student(num_quiz),
            Student(num_quiz),
    };
    int i = 0;
    for (i = 0; i < num_student; i++) {
        set_student(list[i], num_quiz);
    }

    std::cout << "\nResult:\n";
    for (i = 0; i < num_student; i++) {
        std::cout << std::endl << list[i];
        std::cout << "average: " << list[i].get_average() << std::endl;
    }
    std::cout << "Done!\n";
}